

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::anon_unknown_1::BinaryWriterSpec::WriteVar(BinaryWriterSpec *this,Var *var)

{
  if (var->type_ == Name) {
    WriteEscapedString(this,*(string_view *)&var->field_2);
    return;
  }
  if (var->type_ == Index) {
    Stream::Writef(this->json_stream_,"\"%u\"",(ulong)(var->field_2).index_);
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",0x39
                ,"const std::string &wabt::Var::name() const");
}

Assistant:

bool is_index() const { return type_ == VarType::Index; }